

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WirehairCodec.cpp
# Opt level: O0

WirehairResult __thiscall
wirehair::Codec::ReconstructOutput(Codec *this,void *message_out,uint64_t message_bytes)

{
  bool bVar1;
  void *__src;
  void *in_RDX;
  void *in_RSI;
  uint *in_RDI;
  uint8_t *mix1_src;
  uint8_t *mix0_src;
  uint16_t peel_x;
  uint16_t peel_1;
  uint8_t *first;
  uint16_t peel_0;
  RowMixIterator mix;
  PeelRowIterator iter;
  PeelRowParameters params;
  uint32_t block_id_1;
  uint16_t block_count;
  uint block_bytes;
  uint8_t *dest;
  uint bytes;
  uint8_t *dest_1;
  uint32_t block_id;
  uint16_t row_i;
  PeelRow *row;
  uint8_t *src;
  uint8_t *copied_original;
  uint8_t *output_blocks;
  uint i;
  uint16_t x;
  uint16_t distanceToP;
  uint16_t distanceToP_1;
  uint16_t distanceToP_2;
  uint local_144;
  long in_stack_fffffffffffffec8;
  long in_stack_fffffffffffffed0;
  undefined4 in_stack_fffffffffffffed8;
  ushort in_stack_fffffffffffffedc;
  ushort in_stack_fffffffffffffede;
  ushort local_116 [4];
  ushort local_10e;
  ushort local_10c;
  ushort local_10a;
  ushort local_108;
  short local_106;
  ushort local_104;
  ushort local_102;
  ushort local_100;
  ushort local_fe;
  uint local_fc;
  ushort local_f6;
  uint local_f4;
  void *local_f0;
  uint local_e4;
  void *local_e0;
  uint local_d8;
  ushort local_d2;
  uint *local_d0;
  void *__s;
  void *vx;
  WirehairResult local_98;
  uint local_4c;
  ushort local_46;
  ushort local_44;
  ushort local_42;
  int bytes_00;
  ushort in_stack_ffffffffffffffd0;
  ushort in_stack_ffffffffffffffd2;
  ushort in_stack_ffffffffffffffd4;
  ushort in_stack_ffffffffffffffd6;
  ushort *in_stack_ffffffffffffffd8;
  
  if (in_RSI == (void *)0x0) {
    local_98 = Wirehair_InvalidInput;
  }
  else if (in_RDX == (void *)(ulong)(*in_RDI * ((ushort)in_RDI[1] - 1) + in_RDI[0xf])) {
    __s = *(void **)(in_RDI + 0x14);
    memset(__s,0,(ulong)(ushort)in_RDI[1]);
    __src = *(void **)(in_RDI + 0xc);
    local_d0 = *(uint **)(in_RDI + 0x18);
    local_f0 = in_RSI;
    for (local_d2 = 0; local_d2 < *(ushort *)((long)in_RDI + 0x16); local_d2 = local_d2 + 1) {
      local_d8 = *local_d0;
      if (local_d8 < (ushort)in_RDI[1]) {
        local_e0 = (void *)((long)local_f0 + (ulong)(*in_RDI * local_d8));
        if (local_d8 == (ushort)in_RDI[1] - 1) {
          local_144 = in_RDI[0xf];
        }
        else {
          local_144 = *in_RDI;
        }
        local_e4 = local_144;
        memcpy(local_e0,__src,(ulong)local_144);
        *(undefined1 *)((long)__s + (ulong)local_d8) = 1;
      }
      local_d0 = local_d0 + 6;
      __src = (void *)((long)__src + (ulong)*in_RDI);
    }
    local_f4 = *in_RDI;
    local_f6 = (ushort)in_RDI[1];
    vx = local_f0;
    for (local_fc = 0; local_fc < local_f6; local_fc = local_fc + 1) {
      if (*(char *)((long)__s + (ulong)local_fc) == '\0') {
        if (local_fc + 1 == (uint)local_f6) {
          local_f4 = in_RDI[0xf];
        }
        PeelRowParameters::Initialize
                  ((PeelRowParameters *)
                   CONCAT26(in_stack_fffffffffffffede,
                            CONCAT24(in_stack_fffffffffffffedc,in_stack_fffffffffffffed8)),
                   (uint32_t)((ulong)in_stack_fffffffffffffed0 >> 0x20),
                   (uint32_t)in_stack_fffffffffffffed0,
                   (uint16_t)((ulong)in_stack_fffffffffffffec8 >> 0x30),
                   (uint16_t)((ulong)in_stack_fffffffffffffec8 >> 0x20));
        local_108 = *(ushort *)((long)in_RDI + 6);
        local_10e = local_104;
        local_10c = local_102;
        local_10a = local_f6;
        local_42 = (ushort)in_RDI[6];
        local_44 = *(ushort *)((long)in_RDI + 0x1a);
        local_46 = local_100;
        local_116[0] = local_100;
        for (local_4c = 1; local_4c < 3; local_4c = local_4c + 1) {
          in_stack_ffffffffffffffd8 = &local_46;
          local_46 = (ushort)((ulong)((uint)local_46 + (uint)local_fe) %
                             (ulong)(long)(int)(uint)local_44);
          if (local_42 <= local_46) {
            in_stack_ffffffffffffffd0 = local_44 - local_46;
            if (local_fe < in_stack_ffffffffffffffd0) {
              local_46 = (ushort)(((uint)local_fe * 0x10000 - (uint)in_stack_ffffffffffffffd0) %
                                 (uint)local_fe);
            }
            else {
              local_46 = local_fe - in_stack_ffffffffffffffd0;
            }
          }
          local_116[local_4c] = local_46;
          in_stack_ffffffffffffffd2 = local_fe;
          in_stack_ffffffffffffffd4 = local_44;
          in_stack_ffffffffffffffd6 = local_42;
        }
        if (local_106 == 1) {
          bVar1 = false;
          local_116[3] = 0;
        }
        else {
          local_116[3] = local_106 + -2;
          local_10e = (ushort)((ulong)((uint)local_104 + (uint)local_102) %
                              (ulong)(long)(int)(uint)local_108);
          if (local_f6 <= local_10e) {
            local_10e = local_108 - local_10e;
            if (local_102 < local_10e) {
              local_10e = (ushort)(((uint)local_102 * 0x10000 - (uint)local_10e) % (uint)local_102);
            }
            else {
              local_10e = local_102 - local_10e;
            }
          }
          bVar1 = true;
        }
        bytes_00 = (int)((ulong)&local_106 >> 0x20);
        if (bVar1) {
          in_stack_fffffffffffffede = local_10e;
          gf256_addset_mem(in_stack_ffffffffffffffd8,
                           (void *)CONCAT26(in_stack_ffffffffffffffd6,
                                            CONCAT24(in_stack_ffffffffffffffd4,
                                                     CONCAT22(in_stack_ffffffffffffffd2,
                                                              in_stack_ffffffffffffffd0))),local_116
                           ,bytes_00);
          while( true ) {
            if (local_116[3] == 0) {
              bVar1 = false;
            }
            else {
              local_116[3] = local_116[3] + -1;
              local_10e = (ushort)((ulong)((uint)local_10e + (uint)local_10c) %
                                  (ulong)(long)(int)(uint)local_108);
              if (local_10a <= local_10e) {
                local_10e = local_108 - local_10e;
                if (local_10c < local_10e) {
                  local_10e = (ushort)(((uint)local_10c * 0x10000 - (uint)local_10e) %
                                      (uint)local_10c);
                }
                else {
                  local_10e = local_10c - local_10e;
                }
              }
              bVar1 = true;
            }
            if (!bVar1) break;
            in_stack_fffffffffffffedc = local_10e;
            gf256_add_mem((void *)message_bytes,output_blocks,copied_original._4_4_);
          }
          gf256_add_mem((void *)message_bytes,output_blocks,copied_original._4_4_);
        }
        else {
          gf256_addset_mem(in_stack_ffffffffffffffd8,
                           (void *)CONCAT26(in_stack_ffffffffffffffd6,
                                            CONCAT24(in_stack_ffffffffffffffd4,
                                                     CONCAT22(in_stack_ffffffffffffffd2,
                                                              in_stack_ffffffffffffffd0))),local_116
                           ,bytes_00);
        }
        in_stack_fffffffffffffed0 =
             *(long *)(in_RDI + 8) + (ulong)(*in_RDI * ((uint)local_f6 + (uint)local_116[1]));
        in_stack_fffffffffffffec8 =
             *(long *)(in_RDI + 8) + (ulong)(*in_RDI * ((uint)local_f6 + (uint)local_116[2]));
        gf256_add2_mem(in_RDX,vx,__s,(int)((ulong)__src >> 0x20));
      }
      local_f0 = (void *)((long)local_f0 + (ulong)*in_RDI);
    }
    local_98 = Wirehair_Success;
  }
  else {
    local_98 = Wirehair_InvalidInput;
  }
  return local_98;
}

Assistant:

WirehairResult Codec::ReconstructOutput(
    void * GF256_RESTRICT message_out,
    uint64_t message_bytes)
{
    CAT_IF_DUMP(cout << endl << "---- ReconstructOutput ----" << endl << endl;)

    // Validate input
    if (!message_out) {
        return Wirehair_InvalidInput;
    }
    if (message_bytes != _block_bytes * (_block_count - 1) + _output_final_bytes) {
        CAT_DEBUG_BREAK();
        return Wirehair_InvalidInput;
    }
    uint8_t * GF256_RESTRICT output_blocks = reinterpret_cast<uint8_t *>( message_out );

#if defined(CAT_COPY_FIRST_N)
    // Re-purpose and initialize an array to store whether or not each row id needs to be regenerated
    uint8_t * GF256_RESTRICT copied_original = _copied_original;
    memset(copied_original, 0, _block_count);

    // Copy any original message rows that were received
    const uint8_t * GF256_RESTRICT src = _input_blocks;
    PeelRow * GF256_RESTRICT row = _peel_rows;

    // For each row:
    for (uint16_t row_i = 0; row_i < _row_count; ++row_i, ++row, src += _block_bytes)
    {
        const uint32_t block_id = row->RecoveryId;

        // If the row identifier indicates it is part of the original message data:
        if (block_id < _block_count)
        {
            CAT_IF_DUMP(cout << "Copying received row " << id << endl;)

            uint8_t * GF256_RESTRICT dest = output_blocks + _block_bytes * block_id;
            const unsigned bytes = (block_id != (unsigned)_block_count - 1) ? _block_bytes : _output_final_bytes;

            memcpy(dest, src, bytes);

            copied_original[block_id] = 1;
        }
    }
#endif // CAT_COPY_FIRST_N

    // Regenerate any rows that got lost:

    uint8_t * GF256_RESTRICT dest = output_blocks;
    unsigned block_bytes = _block_bytes;

    // For each block to generate:
    const uint16_t block_count = _block_count;
    for (uint32_t block_id = 0; block_id < block_count; ++block_id, dest += _block_bytes)
    {
#if defined(CAT_COPY_FIRST_N)
        // If already copied, skip it
        if (copied_original[block_id]) {
            continue;
        }
#endif // CAT_COPY_FIRST_N
        // For last row, use final byte count
        if (block_id + 1 == block_count) {
            block_bytes = _output_final_bytes;
        }

        CAT_IF_DUMP(cout << "Regenerating row " << row_i << ":";)

        PeelRowParameters params;
        params.Initialize(block_id, _p_seed, block_count, _mix_count);

        PeelRowIterator iter(params, block_count, _block_next_prime);
        const RowMixIterator mix(params, _mix_count, _mix_next_prime);

        const uint16_t peel_0 = iter.GetColumn();

        // Remember first column (there is always at least one)
        CAT_DEBUG_ASSERT(peel_0 < _recovery_rows);
        const uint8_t * GF256_RESTRICT first = _recovery_blocks + _block_bytes * peel_0;

        CAT_IF_DUMP(cout << " " << peel_0;)

        // If peeler has multiple columns:
        if (iter.Iterate())
        {
            const uint16_t peel_1 = iter.GetColumn();

            CAT_IF_DUMP(cout << " " << peel_1;)

            // Combine first two columns into output buffer (faster than memcpy + memxor)
            CAT_DEBUG_ASSERT(peel_1 < _recovery_rows);
            gf256_addset_mem(dest, first, _recovery_blocks + _block_bytes * peel_1, block_bytes);

            // For each remaining peeler column:
            while (iter.Iterate())
            {
                const uint16_t peel_x = iter.GetColumn();

                CAT_IF_DUMP(cout << " " << peel_x;)

                // Mix in each column
                CAT_DEBUG_ASSERT(peel_x < _recovery_rows);
                gf256_add_mem(dest, _recovery_blocks + _block_bytes * peel_x, block_bytes);
            }

            // Mix first mixer block in directly
            CAT_DEBUG_ASSERT((unsigned)(block_count + mix.Columns[0]) < _recovery_rows);
            gf256_add_mem(dest, _recovery_blocks + _block_bytes * (block_count + mix.Columns[0]), block_bytes);
        }
        else
        {
            // Mix first with first mixer block (faster than memcpy + memxor)
            CAT_DEBUG_ASSERT((unsigned)(block_count + mix.Columns[0]) < _recovery_rows);
            gf256_addset_mem(dest, first, _recovery_blocks + _block_bytes * (block_count + mix.Columns[0]), block_bytes);
        }

        CAT_IF_DUMP(cout << " " << (block_count + mix.Columns[0]);)

        // Combine remaining two mixer columns together:
        CAT_DEBUG_ASSERT((unsigned)(block_count + mix.Columns[1]) < _recovery_rows);
        const uint8_t *mix0_src = _recovery_blocks + _block_bytes * (block_count + mix.Columns[1]);
        CAT_IF_DUMP(cout << " " << (block_count + mix.Columns[1]);)

        CAT_DEBUG_ASSERT((unsigned)(block_count + mix.Columns[2]) < _recovery_rows);
        const uint8_t *mix1_src = _recovery_blocks + _block_bytes * (block_count + mix.Columns[2]);
        CAT_IF_DUMP(cout << " " << (block_count + mix.Columns[2]);)

        gf256_add2_mem(dest, mix0_src, mix1_src, block_bytes);

        CAT_IF_DUMP(cout << endl;)
    } // next row

    return Wirehair_Success;
}